

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-gl.c
# Opt level: O3

Result host_gl_program(GLuint vert_shader,GLuint frag_shader,GLuint *out_program)

{
  GLuint GVar1;
  undefined8 in_RAX;
  GLint status;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  GVar1 = (*glCreateProgram)();
  (*glAttachShader)(GVar1,vert_shader);
  (*glAttachShader)(GVar1,frag_shader);
  (*glLinkProgram)(GVar1);
  (*glGetProgramiv)(GVar1,0x8b82,&local_24);
  if (local_24 == 0) {
    host_gl_program_cold_1();
  }
  else {
    *out_program = GVar1;
  }
  return (uint)(local_24 == 0);
}

Assistant:

Result host_gl_program(GLuint vert_shader, GLuint frag_shader,
                       GLuint* out_program) {
  GLuint program = glCreateProgram();
  glAttachShader(program, vert_shader);
  glAttachShader(program, frag_shader);
  glLinkProgram(program);
  CHECK_LOG(program, Program, GL_LINK_STATUS, "GL_PROGRAM");
  *out_program = program;
  return OK;
  ON_ERROR_RETURN;
}